

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall
tetgenmesh::delaunizecavity
          (tetgenmesh *this,arraypool *cavpoints,arraypool *cavfaces,arraypool *cavshells,
          arraypool *newtets,arraypool *crosstets,arraypool *misfaces)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  point pdVar8;
  shellface *pppdVar9;
  double dVar10;
  int local_15c;
  uint local_158;
  int j;
  int i;
  int t1ver;
  int bakchecksubfaceflag;
  int bakchecksubsegflag;
  long bakhullsize;
  long baknum;
  double ori;
  insertvertexflags ivf;
  point *parypt;
  point pt [3];
  point pd;
  point pc;
  point pb;
  point pa;
  face *parysh;
  face tmpsh;
  triface *parytet1;
  triface *parytet;
  triface neightet;
  triface searchtet;
  arraypool *crosstets_local;
  arraypool *newtets_local;
  arraypool *cavshells_local;
  arraypool *cavfaces_local;
  arraypool *cavpoints_local;
  tetgenmesh *this_local;
  
  triface::triface((triface *)&neightet.ver);
  triface::triface((triface *)&parytet);
  face::face((face *)&parysh);
  insertvertexflags::insertvertexflags((insertvertexflags *)&ori);
  if (2 < this->b->verbose) {
    printf("      Delaunizing cavity: %ld points, %ld faces.\n",cavpoints->objects,cavfaces->objects
          );
  }
  lVar3 = crosstets->objects;
  lVar4 = this->hullsize;
  iVar1 = this->checksubsegflag;
  iVar2 = this->checksubfaceflag;
  this->hullsize = 0;
  this->checksubsegflag = 0;
  this->checksubfaceflag = 0;
  this->b->verbose = this->b->verbose + -1;
  this->b->plc = 0;
  ori._4_4_ = 1;
  pd = (point)0x0;
  pc = (point)0x0;
  pb = (point)0x0;
  for (local_158 = 0; (long)(int)local_158 < cavfaces->objects; local_158 = local_158 + 1) {
    parytet1 = (triface *)
               (cavfaces->toparray[(int)local_158 >> ((byte)cavfaces->log2objectsperblock & 0x1f)] +
               (int)((local_158 & cavfaces->objectsperblockmark) * cavfaces->objectbytes));
    parytet1->ver = epivot[parytet1->ver];
    pdVar8 = apex(this,parytet1);
    if (pdVar8 != this->dummypoint) {
      pb = org(this,parytet1);
      pc = dest(this,parytet1);
      pd = apex(this,parytet1);
      break;
    }
  }
  pt[2] = (point)0x0;
  for (; (long)(int)local_158 < cavfaces->objects; local_158 = local_158 + 1) {
    parytet1 = (triface *)
               (cavfaces->toparray[(int)local_158 >> ((byte)cavfaces->log2objectsperblock & 0x1f)] +
               (int)((local_158 & cavfaces->objectsperblockmark) * cavfaces->objectbytes));
    org(this,parytet1);
    pt[0] = dest(this,parytet1);
    pt[1] = apex(this,parytet1);
    for (local_15c = 0; local_15c < 3; local_15c = local_15c + 1) {
      if (pt[(long)local_15c + -1] != this->dummypoint) {
        dVar10 = orient3d(pb,pc,pd,pt[(long)local_15c + -1]);
        if ((dVar10 != 0.0) || (NAN(dVar10))) {
          pt[2] = pt[(long)local_15c + -1];
          if (0.0 < dVar10) {
            pt[(long)local_15c + -1] = pb;
            pb = pc;
            pc = pt[(long)local_15c + -1];
          }
          break;
        }
      }
    }
    if (pt[2] != (point)0x0) break;
  }
  initialdelaunay(this,pb,pc,pd,pt[2]);
  for (local_158 = 0; (long)(int)local_158 < cavpoints->objects; local_158 = local_158 + 1) {
    pdVar8 = *(point *)(cavpoints->toparray
                        [(int)local_158 >> ((byte)cavpoints->log2objectsperblock & 0x1f)] +
                       (int)((local_158 & cavpoints->objectsperblockmark) * cavpoints->objectbytes))
    ;
    triface::operator=((triface *)&neightet.ver,&this->recenttet);
    ori._0_4_ = 1;
    insertpoint(this,pdVar8,(triface *)&neightet.ver,(face *)0x0,(face *)0x0,
                (insertvertexflags *)&ori);
  }
  if (2 < this->b->verbose) {
    printf("      Identifying %ld boundary faces of the cavity.\n",cavfaces->objects);
  }
  while( true ) {
    for (local_158 = 0; (long)(int)local_158 < cavfaces->objects; local_158 = local_158 + 1) {
      parytet1 = (triface *)
                 (cavfaces->toparray[(int)local_158 >> ((byte)cavfaces->log2objectsperblock & 0x1f)]
                 + (int)((local_158 & cavfaces->objectsperblockmark) * cavfaces->objectbytes));
      bVar6 = infected(this,parytet1);
      if (!bVar6) {
        parytet1->ver = epivot[parytet1->ver];
        pdVar8 = org(this,parytet1);
        pt[0] = dest(this,parytet1);
        pt[1] = apex(this,parytet1);
        makeshellface(this,this->subfaces,(face *)&parysh);
        setsorg(this,(face *)&parysh,pdVar8);
        setsdest(this,(face *)&parysh,pt[0]);
        setsapex(this,(face *)&parysh,pt[1]);
        neightet.ver = 0;
        neightet._12_4_ = 0;
        iVar7 = scoutsubface(this,(face *)&parysh,(triface *)&neightet.ver,0);
        if (iVar7 == 0) {
          shellfacedealloc(this,this->subfaces,(shellface *)parysh);
          arraypool::newindex(misfaces,(void **)&tmpsh.shver);
          triface::operator=((triface *)tmpsh._8_8_,parytet1);
        }
        else {
          pppdVar9 = (shellface *)encode(this,parytet1);
          parysh->sh = pppdVar9;
          arraypool::newindex(cavshells,&pa);
          face::operator=((face *)pa,(face *)&parysh);
        }
      }
    }
    if (misfaces->objects < 1) break;
    if (2 < this->b->verbose) {
      printf("      Enlarging the cavity. %ld missing bdry faces\n",misfaces->objects);
    }
    for (local_158 = 0; (long)(int)local_158 < cavshells->objects; local_158 = local_158 + 1) {
      pa = (point)(cavshells->toparray
                   [(int)local_158 >> ((byte)cavshells->log2objectsperblock & 0x1f)] +
                  (int)((local_158 & cavshells->objectsperblockmark) * cavshells->objectbytes));
      stpivot(this,(face *)pa,(triface *)&parytet);
      tsdissolve(this,(triface *)&parytet);
      uVar5 = (uint)neightet.tet;
      decode(this,(tetrahedron)(&parytet->tet)[(int)((uint)neightet.tet & 3)],(triface *)&parytet);
      neightet.tet._0_4_ = fsymtbl[(int)uVar5][(int)(uint)neightet.tet];
      tsdissolve(this,(triface *)&parytet);
      shellfacedealloc(this,this->subfaces,(shellface *)*pa);
    }
    arraypool::restart(cavshells);
    for (local_158 = 0; (long)(int)local_158 < cavpoints->objects; local_158 = local_158 + 1) {
      pinfect(this,*(point *)(cavpoints->toparray
                              [(int)local_158 >> ((byte)cavpoints->log2objectsperblock & 0x1f)] +
                             (int)((local_158 & cavpoints->objectsperblockmark) *
                                  cavpoints->objectbytes)));
    }
    for (local_158 = 0; (long)(int)local_158 < misfaces->objects; local_158 = local_158 + 1) {
      parytet1 = (triface *)
                 (misfaces->toparray[(int)local_158 >> ((byte)misfaces->log2objectsperblock & 0x1f)]
                 + (int)((local_158 & misfaces->objectsperblockmark) * misfaces->objectbytes));
      bVar6 = infected(this,parytet1);
      if (!bVar6) {
        infect(this,parytet1);
        arraypool::newindex(crosstets,(void **)&tmpsh.shver);
        triface::operator=((triface *)tmpsh._8_8_,parytet1);
        pt[2] = oppo(this,parytet1);
        bVar6 = pinfected(this,pt[2]);
        if (!bVar6) {
          triface::operator=((triface *)&neightet.ver,&this->recenttet);
          ori._0_4_ = 1;
          insertpoint(this,pt[2],(triface *)&neightet.ver,(face *)0x0,(face *)0x0,
                      (insertvertexflags *)&ori);
          pinfect(this,pt[2]);
          arraypool::newindex(cavpoints,&ivf.parentpt);
          *ivf.parentpt = (double)pt[2];
        }
        for (local_15c = 0; local_15c < 3; local_15c = local_15c + 1) {
          esym(this,parytet1,(triface *)&parytet);
          uVar5 = (uint)neightet.tet;
          decode(this,(tetrahedron)(&parytet->tet)[(int)((uint)neightet.tet & 3)],
                 (triface *)&parytet);
          neightet.tet._0_4_ = fsymtbl[(int)uVar5][(int)(uint)neightet.tet];
          bVar6 = infected(this,(triface *)&parytet);
          if (!bVar6) {
            arraypool::newindex(cavfaces,(void **)&tmpsh.shver);
            triface::operator=((triface *)tmpsh._8_8_,(triface *)&parytet);
          }
          enextself(this,parytet1);
        }
      }
    }
    for (local_158 = 0; (long)(int)local_158 < cavpoints->objects; local_158 = local_158 + 1) {
      puninfect(this,*(point *)(cavpoints->toparray
                                [(int)local_158 >> ((byte)cavpoints->log2objectsperblock & 0x1f)] +
                               (int)((local_158 & cavpoints->objectsperblockmark) *
                                    cavpoints->objectbytes)));
    }
    arraypool::restart(misfaces);
  }
  marktest(this,&this->recenttet);
  arraypool::newindex(newtets,&parytet1);
  triface::operator=(parytet1,&this->recenttet);
  for (local_158 = 0; (long)(int)local_158 < newtets->objects; local_158 = local_158 + 1) {
    triface::operator=((triface *)&neightet.ver,
                       (triface *)
                       (newtets->toparray
                        [(int)local_158 >> ((byte)newtets->log2objectsperblock & 0x1f)] +
                       (int)((local_158 & newtets->objectsperblockmark) * newtets->objectbytes)));
    for (local_15c = 0; local_15c < 4; local_15c = local_15c + 1) {
      decode(this,*(tetrahedron *)(neightet._8_8_ + (long)local_15c * 8),(triface *)&parytet);
      bVar6 = marktested(this,(triface *)&parytet);
      if (!bVar6) {
        marktest(this,(triface *)&parytet);
        arraypool::newindex(newtets,&parytet1);
        triface::operator=(parytet1,(triface *)&parytet);
      }
    }
  }
  arraypool::restart(cavpoints);
  arraypool::restart(cavfaces);
  if (lVar3 < crosstets->objects) {
    this->cavityexpcount = this->cavityexpcount + 1;
  }
  this->hullsize = lVar4;
  this->checksubsegflag = iVar1;
  this->checksubfaceflag = iVar2;
  this->b->verbose = this->b->verbose + 1;
  this->b->plc = 1;
  return;
}

Assistant:

void tetgenmesh::delaunizecavity(arraypool *cavpoints, arraypool *cavfaces, 
                                 arraypool *cavshells, arraypool *newtets, 
                                 arraypool *crosstets, arraypool *misfaces)
{
  triface searchtet, neightet, *parytet, *parytet1;
  face tmpsh, *parysh;
  point pa, pb, pc, pd, pt[3], *parypt;
  insertvertexflags ivf;
  REAL ori;
  long baknum, bakhullsize;
  int bakchecksubsegflag, bakchecksubfaceflag;
  int t1ver; 
  int i, j;

  if (b->verbose > 2) {
    printf("      Delaunizing cavity: %ld points, %ld faces.\n", 
           cavpoints->objects, cavfaces->objects);
  }
  // Remember the current number of crossing tets. It may be enlarged later.
  baknum = crosstets->objects;
  bakhullsize = hullsize;
  bakchecksubsegflag = checksubsegflag;
  bakchecksubfaceflag = checksubfaceflag;
  hullsize = 0l;
  checksubsegflag = 0;
  checksubfaceflag = 0;
  b->verbose--;  // Suppress informations for creating Delaunay tetra.
  b->plc = 0; // Do not check near vertices.

  ivf.bowywat = 1; // Use Bowyer-Watson algorithm.

  // Get four non-coplanar points (no dummypoint).
  pa = pb = pc = NULL;
  for (i = 0; i < cavfaces->objects; i++) {
    parytet = (triface *) fastlookup(cavfaces, i);
    parytet->ver = epivot[parytet->ver];
    if (apex(*parytet) != dummypoint) {
      pa = org(*parytet);
      pb = dest(*parytet);
      pc = apex(*parytet);
      break;
    }
  }
  pd = NULL;
  for (; i < cavfaces->objects; i++) {
    parytet = (triface *) fastlookup(cavfaces, i);
    pt[0] = org(*parytet);
    pt[1] = dest(*parytet);
    pt[2] = apex(*parytet);
    for (j = 0; j < 3; j++) {
      if (pt[j] != dummypoint) { // Do not include a hull point.
        ori = orient3d(pa, pb, pc, pt[j]);
        if (ori != 0) {
          pd = pt[j];
          if (ori > 0) {  // Swap pa and pb.
            pt[j] = pa; pa = pb; pb = pt[j]; 
          }
          break;
        }
      }
    }
    if (pd != NULL) break;
  }

  // Create an init DT.
  initialdelaunay(pa, pb, pc, pd);

  // Incrementally insert the vertices (duplicated vertices are ignored).
  for (i = 0; i < cavpoints->objects; i++) {
    pt[0] = * (point *) fastlookup(cavpoints, i);
    searchtet = recenttet;
    ivf.iloc = (int) OUTSIDE;
    insertpoint(pt[0], &searchtet, NULL, NULL, &ivf);
  }

  if (b->verbose > 2) {
    printf("      Identifying %ld boundary faces of the cavity.\n", 
           cavfaces->objects);
  }

  while (1) {

    // Identify boundary faces. Mark interior tets. Save missing faces.
    for (i = 0; i < cavfaces->objects; i++) {
      parytet = (triface *) fastlookup(cavfaces, i);
      // Skip an interior face (due to the enlargement of the cavity).
      if (infected(*parytet)) continue;
      parytet->ver = epivot[parytet->ver];
      pt[0] = org(*parytet);
      pt[1] = dest(*parytet);
      pt[2] = apex(*parytet);
      // Create a temp subface.
      makeshellface(subfaces, &tmpsh);
      setshvertices(tmpsh, pt[0], pt[1], pt[2]);
      // Insert tmpsh in DT.
      searchtet.tet = NULL; 
      if (scoutsubface(&tmpsh, &searchtet, 0)) { // shflag = 0
        // Inserted! 'tmpsh' must face toward the inside of the cavity.
        // Remember the boundary tet (outside the cavity) in tmpsh 
        //   (use the adjacent tet slot). 
        tmpsh.sh[0] = (shellface) encode(*parytet);
        // Save this subface.
        cavshells->newindex((void **) &parysh);
        *parysh = tmpsh;
      } 
      else {
        // This boundary face is missing.
        shellfacedealloc(subfaces, tmpsh.sh);
        // Save this face in list.
        misfaces->newindex((void **) &parytet1);
        *parytet1 = *parytet;
      }
    } // i

    if (misfaces->objects > 0) {
      if (b->verbose > 2) {
        printf("      Enlarging the cavity. %ld missing bdry faces\n", 
               misfaces->objects);
      }

      // Removing all temporary subfaces.
      for (i = 0; i < cavshells->objects; i++) {
        parysh = (face *) fastlookup(cavshells, i);
        stpivot(*parysh, neightet);
        tsdissolve(neightet); // Detach it from adj. tets.
        fsymself(neightet);
        tsdissolve(neightet);
        shellfacedealloc(subfaces, parysh->sh);
      }
      cavshells->restart();

      // Infect the points which are of the cavity.
      for (i = 0; i < cavpoints->objects; i++) {
        pt[0] = * (point *) fastlookup(cavpoints, i);
        pinfect(pt[0]); // Mark it as inserted.
      }

      // Enlarge the cavity.
      for (i = 0; i < misfaces->objects; i++) {
        // Get a missing face.
        parytet = (triface *) fastlookup(misfaces, i);
        if (!infected(*parytet)) {
          // Put it into crossing tet list.
          infect(*parytet);
          crosstets->newindex((void **) &parytet1);
          *parytet1 = *parytet;
          // Insert the opposite point if it is not in DT.
          pd = oppo(*parytet);
          if (!pinfected(pd)) {
            searchtet = recenttet;
            ivf.iloc = (int) OUTSIDE;
            insertpoint(pd, &searchtet, NULL, NULL, &ivf);
            pinfect(pd);
            cavpoints->newindex((void **) &parypt);
            *parypt = pd;
          }
          // Add three opposite faces into the boundary list.
          for (j = 0; j < 3; j++) {
            esym(*parytet, neightet);
            fsymself(neightet);
            if (!infected(neightet)) {
              cavfaces->newindex((void **) &parytet1);
              *parytet1 = neightet;
            } 
            enextself(*parytet);
          } // j
        } // if (!infected(parytet))
      } // i

      // Uninfect the points which are of the cavity.
      for (i = 0; i < cavpoints->objects; i++) {
        pt[0] = * (point *) fastlookup(cavpoints, i);
        puninfect(pt[0]);
      }

      misfaces->restart();
      continue;
    } // if (misfaces->objects > 0)

    break;

  } // while (1)

  // Collect all tets of the DT. All new tets are marktested.
  marktest(recenttet);
  newtets->newindex((void **) &parytet);
  *parytet = recenttet;
  for (i = 0; i < newtets->objects; i++) {
    searchtet = * (triface *) fastlookup(newtets, i);
    for (j = 0; j < 4; j++) {
      decode(searchtet.tet[j], neightet);
      if (!marktested(neightet)) {
        marktest(neightet);
        newtets->newindex((void **) &parytet);
        *parytet = neightet;
      }
    }
  }

  cavpoints->restart();
  cavfaces->restart();

  if (crosstets->objects > baknum) {
    // The cavity has been enlarged.
    cavityexpcount++;
  }

  // Restore the original values.
  hullsize = bakhullsize;
  checksubsegflag = bakchecksubsegflag;
  checksubfaceflag = bakchecksubfaceflag;
  b->verbose++;
  b->plc = 1;
}